

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocalGraph.cpp
# Opt level: O0

void __thiscall wasm::LocalGraph::LocalGraph(LocalGraph *this,Function *func,Module *module)

{
  pointer module_00;
  optional<wasm::Expression::Id> local_362;
  undefined1 local_360 [8];
  LocalGraphFlower flower;
  Module *module_local;
  Function *func_local;
  LocalGraph *this_local;
  
  flower.setsByIndex.
  super__Vector_base<std::vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>,_std::allocator<std::vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)module;
  LocalGraphBase::LocalGraphBase(&this->super_LocalGraphBase,func,module);
  std::
  map<wasm::Expression_*,_wasm::Expression_**,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_**>_>_>
  ::map(&this->locations);
  std::
  unordered_map<wasm::LocalGet_*,_wasm::SmallSet<wasm::LocalSet_*,_2UL>,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>_>_>
  ::unordered_map(&this->getSetsMap);
  std::
  unordered_map<wasm::LocalSet_*,_std::unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>,_std::hash<wasm::LocalSet_*>,_std::equal_to<wasm::LocalSet_*>,_std::allocator<std::pair<wasm::LocalSet_*const,_std::unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>_>_>_>
  ::unordered_map(&this->setInfluences);
  std::
  unordered_map<wasm::LocalGet_*,_std::unordered_set<wasm::LocalSet_*,_std::hash<wasm::LocalSet_*>,_std::equal_to<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<std::pair<wasm::LocalGet_*const,_std::unordered_set<wasm::LocalSet_*,_std::hash<wasm::LocalSet_*>,_std::equal_to<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>_>_>
  ::unordered_map(&this->getInfluences);
  module_00 = flower.setsByIndex.
              super__Vector_base<std::vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>,_std::allocator<std::vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::optional<wasm::Expression::Id>::optional(&local_362);
  LocalGraphFlower::LocalGraphFlower
            ((LocalGraphFlower *)local_360,&this->getSetsMap,&this->locations,func,
             (Module *)module_00,local_362);
  LocalGraphFlower::flow((LocalGraphFlower *)local_360);
  LocalGraphFlower::~LocalGraphFlower((LocalGraphFlower *)local_360);
  return;
}

Assistant:

LocalGraph::LocalGraph(Function* func, Module* module)
  : LocalGraphBase(func, module) {
  // See comment on the declaration of this field for why we use a raw
  // allocation.
  LocalGraphFlower flower(getSetsMap, locations, func, module);
  flower.flow();

#ifdef LOCAL_GRAPH_DEBUG
  std::cout << "LocalGraph::dump\n";
  for (auto& [get, sets] : getSetsMap) {
    std::cout << "GET\n" << get << " is influenced by\n";
    for (auto* set : sets) {
      std::cout << set << '\n';
    }
  }
  std::cout << "total locations: " << locations.size() << '\n';
#endif
}